

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIAggregator.cpp
# Opt level: O0

void __thiscall adios2::aggregator::MPIAggregator::Close(MPIAggregator *this)

{
  string *hint;
  long in_RDI;
  allocator *this_00;
  allocator local_29;
  string local_28 [40];
  
  if ((*(byte *)(in_RDI + 0x31) & 1) != 0) {
    hint = (string *)(in_RDI + 0x20);
    this_00 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"freeing aggregators comm at Close\n",this_00);
    helper::Comm::Free((Comm *)this_00,hint);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
    *(undefined1 *)(in_RDI + 0x31) = 0;
  }
  return;
}

Assistant:

void MPIAggregator::Close()
{
    if (m_IsActive)
    {
        m_Comm.Free("freeing aggregators comm at Close\n");
        m_IsActive = false;
    }
}